

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_section.cpp
# Opt level: O3

ostream * pstore::repo::operator<<(ostream *os,external_fixup *xfx)

{
  ostream *poVar1;
  char *pcVar2;
  bool bVar3;
  char local_19;
  address local_18;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ name:",7);
  local_18.a_ = (xfx->name).a_.a_;
  poVar1 = pstore::operator<<(os,&local_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", type:",7);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", binding:",10);
  bVar3 = xfx->is_weak == false;
  pcVar2 = "weak";
  if (bVar3) {
    pcVar2 = "strong";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,(ulong)bVar3 * 2 + 4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", offset:",9);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", addend:",9);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  local_19 = '}';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_19,1);
  return poVar1;
}

Assistant:

std::ostream & operator<< (std::ostream & os, external_fixup const & xfx) {
            return os << "{ name:" << xfx.name << ", type:" << static_cast<unsigned> (xfx.type)
                      << ", binding:" << xfx.strength () << ", offset:" << xfx.offset
                      << ", addend:" << xfx.addend << '}';
        }